

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O1

_Bool Hacl_RSAPSS_rsapss_sign
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint32_t dBits,
                uint64_t *skey,uint32_t saltLen,uint8_t *salt,uint32_t msgLen,uint8_t *msg,
                uint8_t *sgnt)

{
  uint len;
  uint64_t b;
  long lVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint32_t i_1;
  uint uVar4;
  uint64_t uVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 extraout_RAX;
  undefined4 in_register_00000014;
  uint8_t *extraout_RDX;
  ulong *extraout_RDX_00;
  uint8_t *unaff_RBX;
  uint8_t *puVar8;
  void *__s;
  ulong uVar9;
  ulong *puVar10;
  byte *pbVar11;
  undefined4 in_register_00000034;
  int iVar12;
  undefined7 in_register_00000039;
  uint64_t *puVar13;
  uint8_t *__s_00;
  undefined4 in_register_0000008c;
  uint32_t i;
  ulong unaff_R12;
  ulong uVar14;
  byte *__s_01;
  uint32_t uVar15;
  uint8_t *unaff_R13;
  uint8_t *input;
  byte bVar16;
  uint emBits;
  uint64_t *a_00;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint8_t *unaff_R15;
  ulong uVar20;
  uint8_t *puVar21;
  byte *res;
  byte abStack_f8 [8];
  undefined8 uStack_f0;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  uint8_t *puStack_c0;
  ulong uStack_b8;
  uint64_t *puStack_b0;
  code *pcStack_80;
  void *local_78 [2];
  uint64_t *local_68;
  uint32_t local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint64_t *local_40;
  uint64_t *local_38;
  
  uVar6 = CONCAT44(in_register_0000008c,saltLen);
  uVar17 = CONCAT71(in_register_00000039,a);
  puVar8 = (uint8_t *)CONCAT44(in_register_00000034,modBits);
  local_78[0] = local_78;
  if (a < 0xc) {
    local_50 = (ulong)a;
    if (saltLen <= -*(int *)(&DAT_001e4f70 + local_50 * 4) - 9U) {
      uVar18 = modBits - 2 >> 3;
      uVar19 = uVar18 + 1;
      if (*(int *)(&DAT_001e4f70 + local_50 * 4) + saltLen + 2 <= uVar19) {
        emBits = modBits - 1;
        uVar4 = emBits >> 6;
        len = uVar4 + 1;
        local_38 = (uint64_t *)(ulong)(uVar4 * 8 + 0x17 & 0xfffffff0);
        puVar13 = (uint64_t *)((long)local_78 + -(long)local_38);
        uVar17 = (ulong)(uVar4 * 8 + 8);
        uVar14 = 0;
        local_78[1] = (void *)CONCAT44(in_register_00000014,eBits);
        local_68 = puVar13;
        local_5c = dBits;
        local_58 = uVar17;
        local_48 = uVar6;
        local_40 = skey;
        *(undefined8 *)((long)&pcStack_80 + -(long)local_38) = 0x169d44;
        memset(puVar13,0,uVar17);
        puVar8 = (uint8_t *)((long)puVar13 - (ulong)(uVar18 + 0x10 & 0xfffffff0));
        puVar8[-8] = 'a';
        puVar8[-7] = 0x9d;
        puVar8[-6] = '\x16';
        puVar8[-5] = '\0';
        puVar8[-4] = '\0';
        puVar8[-3] = '\0';
        puVar8[-2] = '\0';
        puVar8[-1] = '\0';
        memset(puVar8,0,(ulong)uVar19);
        uVar6 = local_48;
        uVar17 = local_50;
        *(uint8_t **)(puVar8 + -0x10) = puVar8;
        puVar8[-0x18] = 0x81;
        puVar8[-0x17] = 0x9d;
        puVar8[-0x16] = '\x16';
        puVar8[-0x15] = '\0';
        puVar8[-0x14] = '\0';
        puVar8[-0x13] = '\0';
        puVar8[-0x12] = '\0';
        puVar8[-0x11] = '\0';
        pss_encode((Spec_Hash_Definitions_hash_alg)uVar17,(uint32_t)uVar6,salt,msgLen,msg,emBits,
                   *(uint8_t **)(puVar8 + -0x10));
        puVar13 = local_68;
        puVar8[-8] = 0x94;
        puVar8[-7] = 0x9d;
        puVar8[-6] = '\x16';
        puVar8[-5] = '\0';
        puVar8[-4] = '\0';
        puVar8[-3] = '\0';
        puVar8[-2] = '\0';
        puVar8[-1] = '\0';
        Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar19,puVar8,puVar13);
        uVar17 = local_58;
        local_50 = (ulong)(emBits >> 3);
        a_00 = (uint64_t *)(puVar8 + -(long)local_38);
        a_00[-1] = 0x169db7;
        memset(a_00,0,uVar17);
        __s = (void *)((long)a_00 - (long)local_38);
        *(undefined8 *)((long)__s + -8) = 0x169dce;
        memset(__s,0,uVar17);
        puVar2 = local_40;
        local_38 = (uint64_t *)((long)local_40 + uVar17);
        local_58 = uVar17 + (long)local_38;
        local_48 = local_58 + (ulong)((int)local_78[1] - 1U >> 6) * 8 + 8;
        uVar5 = *local_40;
        *(undefined8 *)((long)__s + -8) = 0x169e01;
        uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar5);
        puVar3 = local_38;
        uVar15 = local_5c;
        puVar13 = local_68;
        *(uint64_t **)((long)__s + -8) = a_00;
        *(ulong *)((long)__s + -0x10) = local_48;
        *(undefined8 *)((long)__s + -0x18) = 0x169e23;
        Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
                  (len,puVar2,uVar5,puVar3,puVar13,uVar15,*(uint64_t **)((long)__s + -0x10),
                   *(uint64_t **)((long)__s + -8));
        uVar5 = *local_40;
        *(undefined8 *)((long)__s + -8) = 0x169e33;
        uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar5);
        puVar3 = local_38;
        puVar2 = local_40;
        pvVar7 = local_78[1];
        local_40 = a_00;
        *(void **)((long)__s + -8) = __s;
        *(ulong *)((long)__s + -0x10) = local_58;
        *(undefined8 *)((long)__s + -0x18) = 0x169e55;
        Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64
                  (len,puVar2,uVar5,puVar3,a_00,(uint32_t)pvVar7,*(uint64_t **)((long)__s + -0x10),
                   *(uint64_t **)((long)__s + -8));
        uVar17 = 0xffffffffffffffff;
        do {
          uVar5 = puVar13[uVar14];
          b = *(uint64_t *)((long)__s + uVar14 * 8);
          *(undefined8 *)((long)__s + -8) = 0x169e6d;
          uVar5 = FStar_UInt64_eq_mask(uVar5,b);
          puVar2 = local_40;
          uVar17 = uVar17 & uVar5;
          uVar14 = uVar14 + 1;
        } while (len != uVar14);
        uVar6 = 0;
        do {
          local_40[uVar6] = local_40[uVar6] & uVar17;
          uVar6 = uVar6 + 1;
        } while (len != uVar6);
        iVar12 = (int)local_50;
        *(undefined8 *)((long)__s + -8) = 0x169ea0;
        Hacl_Bignum_Convert_bn_to_bytes_be_uint64(iVar12 + 1,puVar2,sgnt);
        return uVar17 == 0xffffffffffffffff;
      }
    }
    return false;
  }
  pcStack_80 = pss_encode;
  Hacl_RSAPSS_rsapss_sign_cold_1();
  uVar18 = (uint)uVar17;
  input = (uint8_t *)&uStack_f0;
  uStack_b8 = CONCAT44(uStack_b8._4_4_,dBits);
  bVar16 = (byte)(uVar17 & 0xffffffff);
  uStack_e8 = uVar6;
  puStack_b0 = skey;
  if (0xb < bVar16) {
    abStack_f8[0] = 0;
    abStack_f8[1] = 0xa1;
    abStack_f8[2] = 0x16;
    abStack_f8[3] = 0;
    abStack_f8[4] = 0;
    abStack_f8[5] = 0;
    abStack_f8[6] = 0;
    abStack_f8[7] = 0;
    pcStack_80 = (code *)&stack0xfffffffffffffff8;
    pss_encode_cold_1();
LAB_0016a100:
    input[-8] = '\x05';
    input[-7] = 0xa1;
    input[-6] = '\x16';
    input[-5] = '\0';
    input[-4] = '\0';
    input[-3] = '\0';
    input[-2] = '\0';
    input[-1] = '\0';
    pss_encode_cold_3();
LAB_0016a105:
    *(code **)(input + -8) = Hacl_Bignum_Convert_bn_from_bytes_be_uint64;
    pss_encode_cold_2();
    *(code ***)(input + -8) = &pcStack_80;
    *(uint8_t **)(input + -0x10) = unaff_R15;
    *(ulong *)(input + -0x18) = uVar17 & 0xffffffff;
    *(uint8_t **)(input + -0x20) = unaff_R13;
    *(ulong *)(input + -0x28) = unaff_R12;
    *(uint8_t **)(input + -0x30) = unaff_RBX;
    *(undefined8 *)(input + -0x38) = extraout_RAX;
    *(uint8_t **)(input + -0x38) = puVar8;
    uVar19 = uVar18 - 1 & 0xfffffff8;
    uVar6 = (ulong)uVar19;
    uVar17 = (ulong)(uVar19 + 8);
    puVar8 = input + (-0x38 - (uVar17 + 0xf & 0xfffffffffffffff0));
    puVar8[-8] = 'M';
    puVar8[-7] = 0xa1;
    puVar8[-6] = '\x16';
    puVar8[-5] = '\0';
    puVar8[-4] = '\0';
    puVar8[-3] = '\0';
    puVar8[-2] = '\0';
    puVar8[-1] = '\0';
    memset(puVar8,0,uVar17);
    pvVar7 = *(void **)(input + -0x38);
    puVar8[-8] = 'b';
    puVar8[-7] = 0xa1;
    puVar8[-6] = '\x16';
    puVar8[-5] = '\0';
    puVar8[-4] = '\0';
    puVar8[-3] = '\0';
    puVar8[-2] = '\0';
    puVar8[-1] = '\0';
    memcpy(puVar8 + (uVar17 - uVar18),pvVar7,(ulong)uVar18);
    puVar10 = extraout_RDX_00;
    do {
      uVar17 = *(ulong *)(puVar8 + (uVar6 & 0xffffffff));
      *puVar10 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                 (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                 (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                 (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
      uVar6 = uVar6 - 8;
      puVar10 = puVar10 + 1;
    } while (uVar6 != 0xfffffffffffffff8);
    return SUB81(uVar17 >> 0x38,0);
  }
  uVar20 = (ulong)puVar8 & 0xffffffff;
  unaff_R12 = uVar17 & 0xff;
  uVar18 = *(uint *)(&DAT_001e4f70 + unaff_R12 * 4);
  uVar14 = (ulong)uVar18;
  lVar1 = -(uVar14 + 0xf & 0xfffffffffffffff0);
  __s_00 = (uint8_t *)((long)&uStack_f0 + lVar1);
  pbVar11 = abStack_f8 + lVar1;
  uStack_f0 = extraout_RDX;
  puStack_c0 = __s_00;
  pcStack_80 = (code *)&stack0xfffffffffffffff8;
  pbVar11[0] = 0x18;
  pbVar11[1] = 0x9f;
  pbVar11[2] = 0x16;
  pbVar11[3] = 0;
  pbVar11[4] = 0;
  pbVar11[5] = 0;
  pbVar11[6] = 0;
  pbVar11[7] = 0;
  memset(__s_00,0,uVar14);
  uVar6 = (ulong)((int)puVar8 + uVar18 + 8);
  uVar9 = uVar6 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar9;
  input = __s_00 + lVar1;
  puVar8 = (uint8_t *)0x0;
  uStack_e0 = uVar20;
  uStack_d0 = uVar14;
  uStack_c8 = uVar6;
  input[-8] = 'I';
  input[-7] = 0x9f;
  input[-6] = '\x16';
  input[-5] = '\0';
  input[-4] = '\0';
  input[-3] = '\0';
  input[-2] = '\0';
  input[-1] = '\0';
  puVar21 = input;
  memset(input,0,uVar6);
  puVar13 = puStack_b0;
  unaff_RBX = puStack_c0;
  uVar18 = (uint)puVar21;
  unaff_R15 = __s_00 + (8 - uVar9);
  uVar15 = (uint32_t)uStack_b8;
  unaff_R13 = input;
  uStack_d8 = unaff_R12;
  if (bVar16 == 3) {
    input[-8] = 0xa2;
    input[-7] = 0x9f;
    input[-6] = '\x16';
    input[-5] = '\0';
    input[-4] = '\0';
    input[-3] = '\0';
    input[-2] = '\0';
    input[-1] = '\0';
    Hacl_Hash_SHA2_hash_512(unaff_R15,(uint8_t *)puVar13,uVar15);
    unaff_RBX = puStack_c0;
  }
  else if ((int)unaff_R12 == 2) {
    input[-8] = 0x91;
    input[-7] = 0x9f;
    input[-6] = '\x16';
    input[-5] = '\0';
    input[-4] = '\0';
    input[-3] = '\0';
    input[-2] = '\0';
    input[-1] = '\0';
    Hacl_Hash_SHA2_hash_384(unaff_R15,(uint8_t *)puVar13,uVar15);
    unaff_RBX = puStack_c0;
  }
  else {
    if ((int)unaff_R12 != 1) goto LAB_0016a100;
    input[-8] = 0x80;
    input[-7] = 0x9f;
    input[-6] = '\x16';
    input[-5] = '\0';
    input[-4] = '\0';
    input[-3] = '\0';
    input[-2] = '\0';
    input[-1] = '\0';
    Hacl_Hash_SHA2_hash_256(unaff_R15,(uint8_t *)puVar13,uVar15);
  }
  puVar21 = unaff_R15 + uStack_d0;
  unaff_R12 = uStack_e0 & 0xffffffff;
  builtin_memcpy(__s_00 + lVar1 + -8,"\x1f\x16",4);
  input[-4] = '\0';
  input[-3] = '\0';
  input[-2] = '\0';
  input[-1] = '\0';
  puVar8 = uStack_f0;
  memcpy(puVar21,uStack_f0,unaff_R12);
  uVar18 = (uint)puVar21;
  uVar15 = (uint32_t)uStack_c8;
  uStack_b8 = unaff_R12;
  if (bVar16 == 3) {
    input[-8] = '\r';
    input[-7] = 0xa0;
    input[-6] = '\x16';
    input[-5] = '\0';
    input[-4] = '\0';
    input[-3] = '\0';
    input[-2] = '\0';
    input[-1] = '\0';
    Hacl_Hash_SHA2_hash_512(unaff_RBX,input,uVar15);
  }
  else if ((int)uStack_d8 == 2) {
    input[-8] = 0xfc;
    input[-7] = 0x9f;
    input[-6] = '\x16';
    input[-5] = '\0';
    input[-4] = '\0';
    input[-3] = '\0';
    input[-2] = '\0';
    input[-1] = '\0';
    Hacl_Hash_SHA2_hash_384(unaff_RBX,input,uVar15);
  }
  else {
    unaff_R15 = uStack_f0;
    if ((int)uStack_d8 != 1) goto LAB_0016a105;
    input[-8] = 0xeb;
    input[-7] = 0x9f;
    input[-6] = '\x16';
    input[-5] = '\0';
    input[-4] = '\0';
    input[-3] = '\0';
    input[-2] = '\0';
    input[-1] = '\0';
    Hacl_Hash_SHA2_hash_256(unaff_RBX,input,uVar15);
  }
  uVar19 = (int)uStack_e8 - 1U >> 3;
  puStack_b0 = (uint64_t *)(ulong)uVar19;
  uVar15 = (uint32_t)uStack_d0;
  uVar19 = uVar19 - uVar15;
  uVar14 = (ulong)uVar19;
  uVar6 = uVar14 + 0xf & 0xfffffffffffffff0;
  __s_01 = input + -uVar6;
  __s_01[-8] = 0x42;
  __s_01[-7] = 0xa0;
  __s_01[-6] = 0x16;
  __s_01[-5] = 0;
  __s_01[-4] = 0;
  __s_01[-3] = 0;
  __s_01[-2] = 0;
  __s_01[-1] = 0;
  memset(__s_01,0,uVar14);
  uVar18 = (uint)uStack_e0;
  (__s_01 + (ulong)(~uVar18 + uVar19) + 1)[-1] = 1;
  uVar17 = uStack_b8;
  __s_01[-8] = 0x60;
  __s_01[-7] = 0xa0;
  __s_01[-6] = 0x16;
  __s_01[-5] = 0;
  __s_01[-4] = 0;
  __s_01[-3] = 0;
  __s_01[-2] = 0;
  __s_01[-1] = 0;
  memcpy(__s_01 + (ulong)(~uVar18 + uVar19) + 1,uStack_f0,uVar17);
  res = __s_01 + -uVar6;
  res[-8] = 0x76;
  res[-7] = 0xa0;
  res[-6] = 0x16;
  res[-5] = 0;
  res[-4] = 0;
  res[-3] = 0;
  res[-2] = 0;
  res[-1] = 0;
  memset(res,0,uVar14);
  puVar8 = puStack_c0;
  uVar17 = uStack_d8;
  res[-8] = 0x8f;
  res[-7] = 0xa0;
  res[-6] = 0x16;
  res[-5] = 0;
  res[-4] = 0;
  res[-3] = 0;
  res[-2] = 0;
  res[-1] = 0;
  mgf_hash((Spec_Hash_Definitions_hash_alg)uVar17,uVar15,puVar8,uVar19,res);
  puVar13 = puStack_b0;
  if ((uint32_t)puStack_b0 != uVar15) {
    uVar17 = 0;
    do {
      __s_01[uVar17] = __s_01[uVar17] ^ res[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  if ((uStack_e8 & 7) != 0) {
    *__s_01 = *__s_01 & (byte)(0xff >> (8 - ((byte)uStack_e8 & 7) & 0x1f));
  }
  res[-8] = 0xd7;
  res[-7] = 0xa0;
  res[-6] = 0x16;
  res[-5] = 0;
  res[-4] = 0;
  res[-3] = 0;
  res[-2] = 0;
  res[-1] = 0;
  memcpy(local_78[1],__s_01,uVar14);
  uVar17 = uStack_d0;
  res[-8] = 0xe7;
  res[-7] = 0xa0;
  res[-6] = 0x16;
  res[-5] = 0;
  res[-4] = 0;
  res[-3] = 0;
  res[-2] = 0;
  res[-1] = 0;
  pvVar7 = memcpy((void *)((long)local_78[1] + uVar14),puVar8,uVar17);
  *(undefined1 *)((long)local_78[1] + (long)puVar13) = 0xbc;
  return SUB81(pvVar7,0);
}

Assistant:

bool
Hacl_RSAPSS_rsapss_sign(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint64_t *skey,
  uint32_t saltLen,
  uint8_t *salt,
  uint32_t msgLen,
  uint8_t *msg,
  uint8_t *sgnt
)
{
  uint32_t hLen = hash_len(a);
  bool
  b = saltLen <= 0xffffffffU - hLen - 8U && saltLen + hLen + 2U <= (modBits - 1U - 1U) / 8U + 1U;
  if (b)
  {
    uint32_t nLen = (modBits - 1U) / 64U + 1U;
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen);
    uint64_t m[nLen];
    memset(m, 0U, nLen * sizeof (uint64_t));
    uint32_t emBits = modBits - 1U;
    uint32_t emLen = (emBits - 1U) / 8U + 1U;
    KRML_CHECK_SIZE(sizeof (uint8_t), emLen);
    uint8_t em[emLen];
    memset(em, 0U, emLen * sizeof (uint8_t));
    pss_encode(a, saltLen, salt, msgLen, msg, emBits, em);
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(emLen, em, m);
    uint32_t nLen1 = (modBits - 1U) / 64U + 1U;
    uint32_t k = (modBits - 1U) / 8U + 1U;
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen1);
    uint64_t s[nLen1];
    memset(s, 0U, nLen1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen1);
    uint64_t m_[nLen1];
    memset(m_, 0U, nLen1 * sizeof (uint64_t));
    uint32_t nLen2 = (modBits - 1U) / 64U + 1U;
    uint32_t eLen = (eBits - 1U) / 64U + 1U;
    uint64_t *n = skey;
    uint64_t *r2 = skey + nLen2;
    uint64_t *e = skey + nLen2 + nLen2;
    uint64_t *d = skey + nLen2 + nLen2 + eLen;
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64((modBits - 1U) / 64U + 1U,
      n,
      mu,
      r2,
      m,
      dBits,
      d,
      s);
    uint64_t mu0 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64((modBits - 1U) / 64U + 1U,
      n,
      mu0,
      r2,
      s,
      eBits,
      e,
      m_);
    uint64_t mask = 0xFFFFFFFFFFFFFFFFULL;
    for (uint32_t i = 0U; i < nLen2; i++)
    {
      uint64_t uu____0 = FStar_UInt64_eq_mask(m[i], m_[i]);
      mask = uu____0 & mask;
    }
    uint64_t mask1 = mask;
    uint64_t eq_m = mask1;
    for (uint32_t i = 0U; i < nLen2; i++)
    {
      uint64_t *os = s;
      uint64_t x = s[i];
      uint64_t x0 = eq_m & x;
      os[i] = x0;
    }
    bool eq_b = eq_m == 0xFFFFFFFFFFFFFFFFULL;
    Hacl_Bignum_Convert_bn_to_bytes_be_uint64(k, s, sgnt);
    bool eq_b0 = eq_b;
    return eq_b0;
  }
  return false;
}